

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Table.cxx
# Opt level: O2

void __thiscall Fl_Table::rows(Fl_Table *this,int val)

{
  IntVector *this_00;
  int iVar1;
  uint uVar2;
  int *piVar3;
  long lVar4;
  int iVar5;
  
  iVar1 = this->_rows;
  this->_rows = val;
  this_00 = &this->_rowheights;
  uVar2 = (this->_rowheights)._size;
  lVar4 = (long)(int)uVar2;
  if (lVar4 == 0) {
    iVar5 = 0x19;
  }
  else {
    iVar5 = this_00->arr[uVar2 - 1];
  }
  IntVector::size(this_00,val);
  piVar3 = this_00->arr;
  for (; lVar4 < val; lVar4 = lVar4 + 1) {
    piVar3[lVar4] = iVar5;
  }
  table_resized(this);
  if ((iVar1 <= val) && (this->botrow < iVar1)) {
    return;
  }
  Fl_Widget::redraw((Fl_Widget *)this);
  return;
}

Assistant:

void Fl_Table::rows(int val) {
  int oldrows = _rows;
  _rows = val;
  {
    int default_h = ( _rowheights.size() > 0 ) ? _rowheights.back() : 25;
    int now_size = _rowheights.size();
    _rowheights.size(val);			// enlarge or shrink as needed
    while ( now_size < val ) {
      _rowheights[now_size++] = default_h;	// fill new
    }
  }
  table_resized();
  
  // OPTIMIZATION: redraw only if change is visible.
  if ( val >= oldrows && oldrows > botrow ) {
    // NO REDRAW
  } else {
    redraw();
  }
}